

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void idct64_low8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m256i in1;
  __m256i in1_00;
  __m256i in0;
  __m256i in0_00;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int in_ECX;
  uint uVar19;
  int in_EDX;
  int in_R8D;
  __m256i temp2;
  __m256i temp1;
  __m256i u [64];
  __m256i cospi62;
  __m256i cospim58;
  __m256i cospim61;
  __m256i cospi59;
  __m256i cospi5;
  __m256i cospi7;
  __m256i cospim57;
  __m256i cospi63;
  __m256i cospim56;
  __m256i cospim52;
  __m256i cospim48;
  __m256i cospim40;
  __m256i cospim36;
  __m256i cospim32;
  __m256i cospim28;
  __m256i cospim24;
  __m256i cospim20;
  __m256i cospim16;
  __m256i cospim12;
  __m256i cospim8;
  __m256i cospim4;
  __m256i cospi60;
  __m256i cospi56;
  __m256i cospi48;
  __m256i cospi44;
  __m256i cospi40;
  __m256i cospi32;
  __m256i cospi28;
  __m256i cospi24;
  __m256i cospi20;
  __m256i cospi16;
  __m256i cospi12;
  __m256i cospi8;
  __m256i cospi6;
  __m256i cospi4;
  __m256i cospi3;
  __m256i cospi2;
  __m256i cospi1;
  __m256i clamp_hi;
  __m256i clamp_lo;
  int log_range;
  __m256i rnding;
  int32_t *cospi;
  int j;
  int i;
  __m256i *cospim48_00;
  undefined8 in_stack_ffffffffffffe678;
  int bit_00;
  undefined4 in_stack_ffffffffffffe680;
  undefined4 in_stack_ffffffffffffe684;
  int in_stack_ffffffffffffe688;
  undefined4 in_stack_ffffffffffffe68c;
  __m256i *in_stack_ffffffffffffe690;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint bit_01;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint out_shift_00;
  uint bd_00;
  uint do_cols_00;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  int local_18c8;
  longlong local_bc0;
  longlong lStack_bb8;
  longlong lStack_bb0;
  longlong lStack_ba8;
  longlong local_ba0;
  longlong lStack_b98;
  longlong lStack_b90;
  longlong lStack_b88;
  int local_b64;
  undefined1 local_b60 [16];
  undefined1 auStack_b50 [16];
  int32_t *local_b38;
  int local_b30;
  int local_b2c;
  int local_b24;
  int local_b20;
  int local_b1c;
  uint local_b04;
  uint local_b00;
  uint local_afc;
  uint local_af8;
  uint local_af4;
  uint local_af0;
  uint local_aec;
  uint local_ae8;
  uint local_ae4;
  uint local_ae0;
  uint local_adc;
  uint local_ad8;
  uint local_ad4;
  uint local_ad0;
  uint local_acc;
  uint local_ac8;
  uint local_ac4;
  uint local_ac0;
  uint local_abc;
  uint local_ab8;
  uint local_ab4;
  uint local_ab0;
  uint local_aac;
  uint local_aa8;
  uint local_aa4;
  uint local_aa0;
  uint local_a9c;
  uint local_a98;
  uint local_a94;
  uint local_a90;
  uint local_a8c;
  uint local_a88;
  uint local_a84;
  uint local_a80;
  uint local_a7c;
  uint local_a78;
  uint local_a74;
  uint local_a70;
  uint local_a6c;
  uint local_a68;
  uint local_a64;
  undefined1 local_a60 [32];
  uint local_a40;
  uint local_a3c;
  uint local_a38;
  uint local_a34;
  uint local_a30;
  uint local_a2c;
  uint local_a28;
  uint local_a24;
  undefined1 local_a20 [16];
  undefined1 auStack_a10 [16];
  uint local_a00;
  uint local_9fc;
  uint local_9f8;
  uint local_9f4;
  uint local_9f0;
  uint local_9ec;
  uint local_9e8;
  uint local_9e4;
  undefined1 local_9e0 [16];
  undefined1 auStack_9d0 [16];
  uint local_9c0;
  uint local_9bc;
  uint local_9b8;
  uint local_9b4;
  uint local_9b0;
  uint local_9ac;
  uint local_9a8;
  uint local_9a4;
  undefined1 local_9a0 [16];
  undefined1 auStack_990 [16];
  uint local_980;
  uint local_97c;
  uint local_978;
  uint local_974;
  uint local_970;
  uint local_96c;
  uint local_968;
  uint local_964;
  undefined1 local_960 [16];
  undefined1 auStack_950 [16];
  uint local_940;
  uint local_93c;
  uint local_938;
  uint local_934;
  uint local_930;
  uint local_92c;
  uint local_928;
  uint local_924;
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  uint local_900;
  uint local_8fc;
  uint local_8f8;
  uint local_8f4;
  uint local_8f0;
  uint local_8ec;
  uint local_8e8;
  uint local_8e4;
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  uint local_8c0;
  uint local_8bc;
  uint local_8b8;
  uint local_8b4;
  uint local_8b0;
  uint local_8ac;
  uint local_8a8;
  uint local_8a4;
  undefined1 local_8a0 [16];
  undefined1 auStack_890 [16];
  uint local_880;
  uint local_87c;
  uint local_878;
  uint local_874;
  uint local_870;
  uint local_86c;
  uint local_868;
  uint local_864;
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  uint local_840;
  uint local_83c;
  uint local_838;
  uint local_834;
  uint local_830;
  uint local_82c;
  uint local_828;
  uint local_824;
  undefined1 local_820 [16];
  undefined1 auStack_810 [16];
  uint local_800;
  uint local_7fc;
  uint local_7f8;
  uint local_7f4;
  uint local_7f0;
  uint local_7ec;
  uint local_7e8;
  uint local_7e4;
  undefined1 local_7e0 [16];
  undefined1 auStack_7d0 [16];
  uint local_7c0;
  uint local_7bc;
  uint local_7b8;
  uint local_7b4;
  uint local_7b0;
  uint local_7ac;
  uint local_7a8;
  uint local_7a4;
  undefined1 local_7a0 [16];
  undefined1 auStack_790 [16];
  uint local_780;
  uint local_77c;
  uint local_778;
  uint local_774;
  uint local_770;
  uint local_76c;
  uint local_768;
  uint local_764;
  undefined1 local_760 [16];
  undefined1 auStack_750 [16];
  uint local_740;
  uint local_73c;
  uint local_738;
  uint local_734;
  uint local_730;
  uint local_72c;
  uint local_728;
  uint local_724;
  undefined1 local_720 [16];
  undefined1 auStack_710 [16];
  uint local_700;
  uint local_6fc;
  uint local_6f8;
  uint local_6f4;
  uint local_6f0;
  uint local_6ec;
  uint local_6e8;
  uint local_6e4;
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  uint local_6c0;
  uint local_6bc;
  uint local_6b8;
  uint local_6b4;
  uint local_6b0;
  uint local_6ac;
  uint local_6a8;
  uint local_6a4;
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  uint local_680;
  uint local_67c;
  uint local_678;
  uint local_674;
  uint local_670;
  uint local_66c;
  uint local_668;
  uint local_664;
  undefined1 local_660 [16];
  undefined1 auStack_650 [16];
  uint local_640;
  uint local_63c;
  uint local_638;
  uint local_634;
  uint local_630;
  uint local_62c;
  uint local_628;
  uint local_624;
  undefined1 local_620 [16];
  undefined1 auStack_610 [16];
  uint local_600;
  uint local_5fc;
  uint local_5f8;
  uint local_5f4;
  uint local_5f0;
  uint local_5ec;
  uint local_5e8;
  uint local_5e4;
  undefined1 local_5e0 [16];
  undefined1 auStack_5d0 [16];
  uint local_5c0;
  uint local_5bc;
  uint local_5b8;
  uint local_5b4;
  uint local_5b0;
  uint local_5ac;
  uint local_5a8;
  uint local_5a4;
  undefined1 local_5a0 [16];
  undefined1 auStack_590 [16];
  uint local_580;
  uint local_57c;
  uint local_578;
  uint local_574;
  uint local_570;
  uint local_56c;
  uint local_568;
  uint local_564;
  undefined1 local_560 [16];
  undefined1 auStack_550 [16];
  uint local_540;
  uint local_53c;
  uint local_538;
  uint local_534;
  uint local_530;
  uint local_52c;
  uint local_528;
  uint local_524;
  undefined1 local_520 [16];
  undefined1 auStack_510 [16];
  uint local_500;
  uint local_4fc;
  uint local_4f8;
  uint local_4f4;
  uint local_4f0;
  uint local_4ec;
  uint local_4e8;
  uint local_4e4;
  undefined1 local_4e0 [16];
  undefined1 auStack_4d0 [16];
  uint local_4c0;
  uint local_4bc;
  uint local_4b8;
  uint local_4b4;
  uint local_4b0;
  uint local_4ac;
  uint local_4a8;
  uint local_4a4;
  undefined1 local_4a0 [16];
  undefined1 auStack_490 [16];
  uint local_480;
  uint local_47c;
  uint local_478;
  uint local_474;
  uint local_470;
  uint local_46c;
  uint local_468;
  uint local_464;
  undefined1 local_460 [16];
  undefined1 auStack_450 [16];
  uint local_440;
  uint local_43c;
  uint local_438;
  uint local_434;
  uint local_430;
  uint local_42c;
  uint local_428;
  uint local_424;
  undefined1 local_420 [16];
  undefined1 auStack_410 [16];
  uint local_400;
  uint local_3fc;
  uint local_3f8;
  uint local_3f4;
  uint local_3f0;
  uint local_3ec;
  uint local_3e8;
  uint local_3e4;
  undefined1 local_3e0 [16];
  undefined1 auStack_3d0 [16];
  uint local_3c0;
  uint local_3bc;
  uint local_3b8;
  uint local_3b4;
  uint local_3b0;
  uint local_3ac;
  uint local_3a8;
  uint local_3a4;
  undefined1 local_3a0 [16];
  undefined1 auStack_390 [16];
  uint local_380;
  uint local_37c;
  uint local_378;
  uint local_374;
  uint local_370;
  uint local_36c;
  uint local_368;
  uint local_364;
  undefined1 local_360 [16];
  undefined1 auStack_350 [16];
  uint local_340;
  uint local_33c;
  uint local_338;
  uint local_334;
  uint local_330;
  uint local_32c;
  uint local_328;
  uint local_324;
  undefined1 local_320 [16];
  undefined1 auStack_310 [16];
  uint local_300;
  uint local_2fc;
  uint local_2f8;
  uint local_2f4;
  uint local_2f0;
  uint local_2ec;
  uint local_2e8;
  uint local_2e4;
  undefined1 local_2e0 [16];
  undefined1 auStack_2d0 [16];
  uint local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  uint local_2ac;
  uint local_2a8;
  uint local_2a4;
  undefined1 local_2a0 [16];
  undefined1 auStack_290 [16];
  uint local_280;
  uint local_27c;
  uint local_278;
  uint local_274;
  uint local_270;
  uint local_26c;
  uint local_268;
  uint local_264;
  undefined1 local_260 [16];
  undefined1 auStack_250 [16];
  uint local_240;
  uint local_23c;
  uint local_238;
  uint local_234;
  uint local_230;
  uint local_22c;
  uint local_228;
  uint local_224;
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  uint local_200;
  uint local_1fc;
  uint local_1f8;
  uint local_1f4;
  uint local_1f0;
  uint local_1ec;
  uint local_1e8;
  uint local_1e4;
  undefined1 local_1e0 [16];
  undefined1 auStack_1d0 [16];
  uint local_1c0;
  uint local_1bc;
  uint local_1b8;
  uint local_1b4;
  uint local_1b0;
  uint local_1ac;
  uint local_1a8;
  uint local_1a4;
  undefined1 local_1a0 [16];
  undefined1 auStack_190 [16];
  uint local_180;
  uint local_17c;
  uint local_178;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  uint local_164;
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  uint local_140;
  uint local_13c;
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  undefined1 local_e0 [16];
  undefined1 auStack_d0 [16];
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  undefined1 local_a0 [16];
  undefined1 auStack_90 [16];
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  undefined1 local_60 [32];
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  
  bit_00 = (int)((ulong)in_stack_ffffffffffffe678 >> 0x20);
  local_b24 = in_R8D;
  local_b20 = in_ECX;
  local_b1c = in_EDX;
  local_b38 = cospi_arr(in_EDX);
  local_a64 = 1 << ((char)local_b1c - 1U & 0x1f);
  auVar1 = vpinsrd_avx(ZEXT416(local_a64),local_a64,1);
  auVar1 = vpinsrd_avx(auVar1,local_a64,2);
  auVar1 = vpinsrd_avx(auVar1,local_a64,3);
  auVar2 = vpinsrd_avx(ZEXT416(local_a64),local_a64,1);
  auVar2 = vpinsrd_avx(auVar2,local_a64,2);
  auVar2 = vpinsrd_avx(auVar2,local_a64,3);
  local_a60._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  local_a60._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  iVar3 = 8;
  if (local_b20 != 0) {
    iVar3 = 6;
  }
  if (local_b24 + iVar3 < 0x10) {
    local_18c8 = 0x10;
  }
  else {
    local_18c8 = 8;
    if (local_b20 != 0) {
      local_18c8 = 6;
    }
    local_18c8 = local_b24 + local_18c8;
  }
  local_b64 = local_18c8;
  iVar3 = local_b64;
  local_b64._0_1_ = (char)local_18c8;
  uVar19 = -(1 << ((char)local_b64 - 1U & 0x1f));
  auVar1 = vpinsrd_avx(ZEXT416(uVar19),uVar19,1);
  auVar1 = vpinsrd_avx(auVar1,uVar19,2);
  local_a20 = vpinsrd_avx(auVar1,uVar19,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar19),uVar19,1);
  auVar1 = vpinsrd_avx(auVar1,uVar19,2);
  auStack_a10 = vpinsrd_avx(auVar1,uVar19,3);
  local_ba0 = local_a20._0_8_;
  lStack_b98 = local_a20._8_8_;
  lStack_b90 = auStack_a10._0_8_;
  lStack_b88 = auStack_a10._8_8_;
  uVar4 = (1 << ((char)local_b64 - 1U & 0x1f)) - 1;
  auVar1 = vpinsrd_avx(ZEXT416(uVar4),uVar4,1);
  auVar1 = vpinsrd_avx(auVar1,uVar4,2);
  local_9e0 = vpinsrd_avx(auVar1,uVar4,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar4),uVar4,1);
  auVar1 = vpinsrd_avx(auVar1,uVar4,2);
  auStack_9d0 = vpinsrd_avx(auVar1,uVar4,3);
  local_bc0 = local_9e0._0_8_;
  lStack_bb8 = local_9e0._8_8_;
  lStack_bb0 = auStack_9d0._0_8_;
  lStack_ba8 = auStack_9d0._8_8_;
  uVar20 = local_b38[1];
  auVar1 = vpinsrd_avx(ZEXT416(uVar20),uVar20,1);
  auVar1 = vpinsrd_avx(auVar1,uVar20,2);
  local_9a0 = vpinsrd_avx(auVar1,uVar20,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar20),uVar20,1);
  auVar1 = vpinsrd_avx(auVar1,uVar20,2);
  auStack_990 = vpinsrd_avx(auVar1,uVar20,3);
  uVar21 = local_b38[2];
  auVar1 = vpinsrd_avx(ZEXT416(uVar21),uVar21,1);
  auVar1 = vpinsrd_avx(auVar1,uVar21,2);
  local_960 = vpinsrd_avx(auVar1,uVar21,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar21),uVar21,1);
  auVar1 = vpinsrd_avx(auVar1,uVar21,2);
  auStack_950 = vpinsrd_avx(auVar1,uVar21,3);
  uVar22 = local_b38[3];
  auVar1 = vpinsrd_avx(ZEXT416(uVar22),uVar22,1);
  auVar1 = vpinsrd_avx(auVar1,uVar22,2);
  local_920 = vpinsrd_avx(auVar1,uVar22,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar22),uVar22,1);
  auVar1 = vpinsrd_avx(auVar1,uVar22,2);
  auStack_910 = vpinsrd_avx(auVar1,uVar22,3);
  bit_01 = local_b38[4];
  auVar1 = vpinsrd_avx(ZEXT416(bit_01),bit_01,1);
  auVar1 = vpinsrd_avx(auVar1,bit_01,2);
  local_8e0 = vpinsrd_avx(auVar1,bit_01,3);
  auVar1 = vpinsrd_avx(ZEXT416(bit_01),bit_01,1);
  auVar1 = vpinsrd_avx(auVar1,bit_01,2);
  auStack_8d0 = vpinsrd_avx(auVar1,bit_01,3);
  uVar23 = local_b38[6];
  auVar1 = vpinsrd_avx(ZEXT416(uVar23),uVar23,1);
  auVar1 = vpinsrd_avx(auVar1,uVar23,2);
  local_8a0 = vpinsrd_avx(auVar1,uVar23,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar23),uVar23,1);
  auVar1 = vpinsrd_avx(auVar1,uVar23,2);
  auStack_890 = vpinsrd_avx(auVar1,uVar23,3);
  uVar24 = local_b38[8];
  auVar1 = vpinsrd_avx(ZEXT416(uVar24),uVar24,1);
  auVar1 = vpinsrd_avx(auVar1,uVar24,2);
  local_860 = vpinsrd_avx(auVar1,uVar24,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar24),uVar24,1);
  auVar1 = vpinsrd_avx(auVar1,uVar24,2);
  auStack_850 = vpinsrd_avx(auVar1,uVar24,3);
  uVar25 = local_b38[0xc];
  auVar1 = vpinsrd_avx(ZEXT416(uVar25),uVar25,1);
  auVar1 = vpinsrd_avx(auVar1,uVar25,2);
  local_820 = vpinsrd_avx(auVar1,uVar25,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar25),uVar25,1);
  auVar1 = vpinsrd_avx(auVar1,uVar25,2);
  auStack_810 = vpinsrd_avx(auVar1,uVar25,3);
  uVar26 = local_b38[0x10];
  auVar1 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
  auVar1 = vpinsrd_avx(auVar1,uVar26,2);
  local_7e0 = vpinsrd_avx(auVar1,uVar26,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
  auVar1 = vpinsrd_avx(auVar1,uVar26,2);
  auStack_7d0 = vpinsrd_avx(auVar1,uVar26,3);
  uVar27 = local_b38[0x14];
  auVar1 = vpinsrd_avx(ZEXT416(uVar27),uVar27,1);
  auVar1 = vpinsrd_avx(auVar1,uVar27,2);
  local_7a0 = vpinsrd_avx(auVar1,uVar27,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar27),uVar27,1);
  auVar1 = vpinsrd_avx(auVar1,uVar27,2);
  auStack_790 = vpinsrd_avx(auVar1,uVar27,3);
  uVar28 = local_b38[0x18];
  auVar1 = vpinsrd_avx(ZEXT416(uVar28),uVar28,1);
  auVar1 = vpinsrd_avx(auVar1,uVar28,2);
  local_760 = vpinsrd_avx(auVar1,uVar28,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar28),uVar28,1);
  auVar1 = vpinsrd_avx(auVar1,uVar28,2);
  auStack_750 = vpinsrd_avx(auVar1,uVar28,3);
  uVar29 = local_b38[0x1c];
  auVar1 = vpinsrd_avx(ZEXT416(uVar29),uVar29,1);
  auVar1 = vpinsrd_avx(auVar1,uVar29,2);
  local_720 = vpinsrd_avx(auVar1,uVar29,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar29),uVar29,1);
  auVar1 = vpinsrd_avx(auVar1,uVar29,2);
  auStack_710 = vpinsrd_avx(auVar1,uVar29,3);
  uVar30 = local_b38[0x20];
  auVar1 = vpinsrd_avx(ZEXT416(uVar30),uVar30,1);
  auVar1 = vpinsrd_avx(auVar1,uVar30,2);
  local_6e0 = vpinsrd_avx(auVar1,uVar30,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar30),uVar30,1);
  auVar1 = vpinsrd_avx(auVar1,uVar30,2);
  auStack_6d0 = vpinsrd_avx(auVar1,uVar30,3);
  uVar31 = local_b38[0x28];
  auVar1 = vpinsrd_avx(ZEXT416(uVar31),uVar31,1);
  auVar1 = vpinsrd_avx(auVar1,uVar31,2);
  local_6a0 = vpinsrd_avx(auVar1,uVar31,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar31),uVar31,1);
  auVar1 = vpinsrd_avx(auVar1,uVar31,2);
  auStack_690 = vpinsrd_avx(auVar1,uVar31,3);
  out_shift_00 = local_b38[0x2c];
  auVar1 = vpinsrd_avx(ZEXT416(out_shift_00),out_shift_00,1);
  auVar1 = vpinsrd_avx(auVar1,out_shift_00,2);
  local_660 = vpinsrd_avx(auVar1,out_shift_00,3);
  auVar1 = vpinsrd_avx(ZEXT416(out_shift_00),out_shift_00,1);
  auVar1 = vpinsrd_avx(auVar1,out_shift_00,2);
  auStack_650 = vpinsrd_avx(auVar1,out_shift_00,3);
  bd_00 = local_b38[0x30];
  auVar1 = vpinsrd_avx(ZEXT416(bd_00),bd_00,1);
  auVar1 = vpinsrd_avx(auVar1,bd_00,2);
  local_620 = vpinsrd_avx(auVar1,bd_00,3);
  auVar1 = vpinsrd_avx(ZEXT416(bd_00),bd_00,1);
  auVar1 = vpinsrd_avx(auVar1,bd_00,2);
  auStack_610 = vpinsrd_avx(auVar1,bd_00,3);
  do_cols_00 = local_b38[0x38];
  auVar1 = vpinsrd_avx(ZEXT416(do_cols_00),do_cols_00,1);
  auVar1 = vpinsrd_avx(auVar1,do_cols_00,2);
  local_5e0 = vpinsrd_avx(auVar1,do_cols_00,3);
  auVar1 = vpinsrd_avx(ZEXT416(do_cols_00),do_cols_00,1);
  auVar1 = vpinsrd_avx(auVar1,do_cols_00,2);
  auStack_5d0 = vpinsrd_avx(auVar1,do_cols_00,3);
  uVar32 = local_b38[0x3c];
  auVar1 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar1 = vpinsrd_avx(auVar1,uVar32,2);
  local_5a0 = vpinsrd_avx(auVar1,uVar32,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar1 = vpinsrd_avx(auVar1,uVar32,2);
  auStack_590 = vpinsrd_avx(auVar1,uVar32,3);
  uVar5 = -local_b38[4];
  auVar1 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
  auVar1 = vpinsrd_avx(auVar1,uVar5,2);
  local_560 = vpinsrd_avx(auVar1,uVar5,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
  auVar1 = vpinsrd_avx(auVar1,uVar5,2);
  auStack_550 = vpinsrd_avx(auVar1,uVar5,3);
  uVar6 = -local_b38[8];
  auVar1 = vpinsrd_avx(ZEXT416(uVar6),uVar6,1);
  auVar1 = vpinsrd_avx(auVar1,uVar6,2);
  local_520 = vpinsrd_avx(auVar1,uVar6,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar6),uVar6,1);
  auVar1 = vpinsrd_avx(auVar1,uVar6,2);
  auStack_510 = vpinsrd_avx(auVar1,uVar6,3);
  uVar7 = -local_b38[0xc];
  auVar1 = vpinsrd_avx(ZEXT416(uVar7),uVar7,1);
  auVar1 = vpinsrd_avx(auVar1,uVar7,2);
  local_4e0 = vpinsrd_avx(auVar1,uVar7,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar7),uVar7,1);
  auVar1 = vpinsrd_avx(auVar1,uVar7,2);
  auStack_4d0 = vpinsrd_avx(auVar1,uVar7,3);
  uVar8 = -local_b38[0x10];
  auVar1 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
  auVar1 = vpinsrd_avx(auVar1,uVar8,2);
  local_4a0 = vpinsrd_avx(auVar1,uVar8,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
  auVar1 = vpinsrd_avx(auVar1,uVar8,2);
  auStack_490 = vpinsrd_avx(auVar1,uVar8,3);
  uVar9 = -local_b38[0x14];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  local_460 = vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  auStack_450 = vpinsrd_avx(auVar1,uVar9,3);
  uVar10 = -local_b38[0x18];
  auVar1 = vpinsrd_avx(ZEXT416(uVar10),uVar10,1);
  auVar1 = vpinsrd_avx(auVar1,uVar10,2);
  local_420 = vpinsrd_avx(auVar1,uVar10,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar10),uVar10,1);
  auVar1 = vpinsrd_avx(auVar1,uVar10,2);
  auStack_410 = vpinsrd_avx(auVar1,uVar10,3);
  uVar11 = -local_b38[0x1c];
  auVar1 = vpinsrd_avx(ZEXT416(uVar11),uVar11,1);
  auVar1 = vpinsrd_avx(auVar1,uVar11,2);
  local_3e0 = vpinsrd_avx(auVar1,uVar11,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar11),uVar11,1);
  auVar1 = vpinsrd_avx(auVar1,uVar11,2);
  auStack_3d0 = vpinsrd_avx(auVar1,uVar11,3);
  uVar12 = -local_b38[0x20];
  auVar1 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar1 = vpinsrd_avx(auVar1,uVar12,2);
  local_3a0 = vpinsrd_avx(auVar1,uVar12,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar1 = vpinsrd_avx(auVar1,uVar12,2);
  auStack_390 = vpinsrd_avx(auVar1,uVar12,3);
  uVar13 = -local_b38[0x24];
  auVar1 = vpinsrd_avx(ZEXT416(uVar13),uVar13,1);
  auVar1 = vpinsrd_avx(auVar1,uVar13,2);
  local_360 = vpinsrd_avx(auVar1,uVar13,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar13),uVar13,1);
  auVar1 = vpinsrd_avx(auVar1,uVar13,2);
  auStack_350 = vpinsrd_avx(auVar1,uVar13,3);
  uVar14 = -local_b38[0x28];
  auVar1 = vpinsrd_avx(ZEXT416(uVar14),uVar14,1);
  auVar1 = vpinsrd_avx(auVar1,uVar14,2);
  local_320 = vpinsrd_avx(auVar1,uVar14,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar14),uVar14,1);
  auVar1 = vpinsrd_avx(auVar1,uVar14,2);
  auStack_310 = vpinsrd_avx(auVar1,uVar14,3);
  uVar15 = -local_b38[0x30];
  auVar1 = vpinsrd_avx(ZEXT416(uVar15),uVar15,1);
  auVar1 = vpinsrd_avx(auVar1,uVar15,2);
  local_2e0 = vpinsrd_avx(auVar1,uVar15,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar15),uVar15,1);
  auVar1 = vpinsrd_avx(auVar1,uVar15,2);
  auStack_2d0 = vpinsrd_avx(auVar1,uVar15,3);
  uVar16 = -local_b38[0x34];
  auVar1 = vpinsrd_avx(ZEXT416(uVar16),uVar16,1);
  auVar1 = vpinsrd_avx(auVar1,uVar16,2);
  local_2a0 = vpinsrd_avx(auVar1,uVar16,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar16),uVar16,1);
  auVar1 = vpinsrd_avx(auVar1,uVar16,2);
  auStack_290 = vpinsrd_avx(auVar1,uVar16,3);
  uVar17 = -local_b38[0x38];
  auVar1 = vpinsrd_avx(ZEXT416(uVar17),uVar17,1);
  auVar1 = vpinsrd_avx(auVar1,uVar17,2);
  local_260 = vpinsrd_avx(auVar1,uVar17,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar17),uVar17,1);
  auVar1 = vpinsrd_avx(auVar1,uVar17,2);
  auStack_250 = vpinsrd_avx(auVar1,uVar17,3);
  uVar33 = local_b38[0x3f];
  auVar1 = vpinsrd_avx(ZEXT416(uVar33),uVar33,1);
  auVar1 = vpinsrd_avx(auVar1,uVar33,2);
  local_220 = vpinsrd_avx(auVar1,uVar33,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar33),uVar33,1);
  auVar1 = vpinsrd_avx(auVar1,uVar33,2);
  auStack_210 = vpinsrd_avx(auVar1,uVar33,3);
  uVar18 = -local_b38[0x39];
  auVar1 = vpinsrd_avx(ZEXT416(uVar18),uVar18,1);
  auVar1 = vpinsrd_avx(auVar1,uVar18,2);
  local_1e0 = vpinsrd_avx(auVar1,uVar18,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar18),uVar18,1);
  auVar1 = vpinsrd_avx(auVar1,uVar18,2);
  auStack_1d0 = vpinsrd_avx(auVar1,uVar18,3);
  uVar34 = local_b38[7];
  auVar1 = vpinsrd_avx(ZEXT416(uVar34),uVar34,1);
  auVar1 = vpinsrd_avx(auVar1,uVar34,2);
  local_1a0 = vpinsrd_avx(auVar1,uVar34,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar34),uVar34,1);
  auVar1 = vpinsrd_avx(auVar1,uVar34,2);
  auStack_190 = vpinsrd_avx(auVar1,uVar34,3);
  uVar35 = local_b38[5];
  auVar1 = vpinsrd_avx(ZEXT416(uVar35),uVar35,1);
  auVar1 = vpinsrd_avx(auVar1,uVar35,2);
  local_160 = vpinsrd_avx(auVar1,uVar35,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar35),uVar35,1);
  auVar1 = vpinsrd_avx(auVar1,uVar35,2);
  auStack_150 = vpinsrd_avx(auVar1,uVar35,3);
  local_af8 = local_b38[0x3b];
  auVar1 = vpinsrd_avx(ZEXT416(local_af8),local_af8,1);
  auVar1 = vpinsrd_avx(auVar1,local_af8,2);
  local_120 = vpinsrd_avx(auVar1,local_af8,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_af8),local_af8,1);
  auVar1 = vpinsrd_avx(auVar1,local_af8,2);
  auStack_110 = vpinsrd_avx(auVar1,local_af8,3);
  local_afc = -local_b38[0x3d];
  auVar1 = vpinsrd_avx(ZEXT416(local_afc),local_afc,1);
  auVar1 = vpinsrd_avx(auVar1,local_afc,2);
  local_e0 = vpinsrd_avx(auVar1,local_afc,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_afc),local_afc,1);
  auVar1 = vpinsrd_avx(auVar1,local_afc,2);
  auStack_d0 = vpinsrd_avx(auVar1,local_afc,3);
  local_b00 = -local_b38[0x3a];
  auVar1 = vpinsrd_avx(ZEXT416(local_b00),local_b00,1);
  auVar1 = vpinsrd_avx(auVar1,local_b00,2);
  local_a0 = vpinsrd_avx(auVar1,local_b00,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_b00),local_b00,1);
  auVar1 = vpinsrd_avx(auVar1,local_b00,2);
  auStack_90 = vpinsrd_avx(auVar1,local_b00,3);
  local_b04 = local_b38[0x3e];
  auVar1 = vpinsrd_avx(ZEXT416(local_b04),local_b04,1);
  auVar1 = vpinsrd_avx(auVar1,local_b04,2);
  auVar1 = vpinsrd_avx(auVar1,local_b04,3);
  auVar2 = vpinsrd_avx(ZEXT416(local_b04),local_b04,1);
  auVar2 = vpinsrd_avx(auVar2,local_b04,2);
  auVar2 = vpinsrd_avx(auVar2,local_b04,3);
  local_60._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  local_60._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  local_b64 = iVar3;
  local_af4 = uVar35;
  local_af0 = uVar34;
  local_aec = uVar18;
  local_ae8 = uVar33;
  local_ae4 = uVar17;
  local_ae0 = uVar16;
  local_adc = uVar15;
  local_ad8 = uVar14;
  local_ad4 = uVar13;
  local_ad0 = uVar12;
  local_acc = uVar11;
  local_ac8 = uVar10;
  local_ac4 = uVar9;
  local_ac0 = uVar8;
  local_abc = uVar7;
  local_ab8 = uVar6;
  local_ab4 = uVar5;
  local_ab0 = uVar32;
  local_aac = do_cols_00;
  local_aa8 = bd_00;
  local_aa4 = out_shift_00;
  local_aa0 = uVar31;
  local_a9c = uVar30;
  local_a98 = uVar29;
  local_a94 = uVar28;
  local_a90 = uVar27;
  local_a8c = uVar26;
  local_a88 = uVar25;
  local_a84 = uVar24;
  local_a80 = uVar23;
  local_a7c = bit_01;
  local_a78 = uVar22;
  local_a74 = uVar21;
  local_a70 = uVar20;
  local_a6c = uVar4;
  local_a68 = uVar19;
  local_a40 = local_a64;
  local_a3c = local_a64;
  local_a38 = local_a64;
  local_a34 = local_a64;
  local_a30 = local_a64;
  local_a2c = local_a64;
  local_a28 = local_a64;
  local_a24 = local_a64;
  local_a00 = uVar19;
  local_9fc = uVar19;
  local_9f8 = uVar19;
  local_9f4 = uVar19;
  local_9f0 = uVar19;
  local_9ec = uVar19;
  local_9e8 = uVar19;
  local_9e4 = uVar19;
  local_9c0 = uVar4;
  local_9bc = uVar4;
  local_9b8 = uVar4;
  local_9b4 = uVar4;
  local_9b0 = uVar4;
  local_9ac = uVar4;
  local_9a8 = uVar4;
  local_9a4 = uVar4;
  local_980 = uVar20;
  local_97c = uVar20;
  local_978 = uVar20;
  local_974 = uVar20;
  local_970 = uVar20;
  local_96c = uVar20;
  local_968 = uVar20;
  local_964 = uVar20;
  local_940 = uVar21;
  local_93c = uVar21;
  local_938 = uVar21;
  local_934 = uVar21;
  local_930 = uVar21;
  local_92c = uVar21;
  local_928 = uVar21;
  local_924 = uVar21;
  local_900 = uVar22;
  local_8fc = uVar22;
  local_8f8 = uVar22;
  local_8f4 = uVar22;
  local_8f0 = uVar22;
  local_8ec = uVar22;
  local_8e8 = uVar22;
  local_8e4 = uVar22;
  local_8c0 = bit_01;
  local_8bc = bit_01;
  local_8b8 = bit_01;
  local_8b4 = bit_01;
  local_8b0 = bit_01;
  local_8ac = bit_01;
  local_8a8 = bit_01;
  local_8a4 = bit_01;
  local_880 = uVar23;
  local_87c = uVar23;
  local_878 = uVar23;
  local_874 = uVar23;
  local_870 = uVar23;
  local_86c = uVar23;
  local_868 = uVar23;
  local_864 = uVar23;
  local_840 = uVar24;
  local_83c = uVar24;
  local_838 = uVar24;
  local_834 = uVar24;
  local_830 = uVar24;
  local_82c = uVar24;
  local_828 = uVar24;
  local_824 = uVar24;
  local_800 = uVar25;
  local_7fc = uVar25;
  local_7f8 = uVar25;
  local_7f4 = uVar25;
  local_7f0 = uVar25;
  local_7ec = uVar25;
  local_7e8 = uVar25;
  local_7e4 = uVar25;
  local_7c0 = uVar26;
  local_7bc = uVar26;
  local_7b8 = uVar26;
  local_7b4 = uVar26;
  local_7b0 = uVar26;
  local_7ac = uVar26;
  local_7a8 = uVar26;
  local_7a4 = uVar26;
  local_780 = uVar27;
  local_77c = uVar27;
  local_778 = uVar27;
  local_774 = uVar27;
  local_770 = uVar27;
  local_76c = uVar27;
  local_768 = uVar27;
  local_764 = uVar27;
  local_740 = uVar28;
  local_73c = uVar28;
  local_738 = uVar28;
  local_734 = uVar28;
  local_730 = uVar28;
  local_72c = uVar28;
  local_728 = uVar28;
  local_724 = uVar28;
  local_700 = uVar29;
  local_6fc = uVar29;
  local_6f8 = uVar29;
  local_6f4 = uVar29;
  local_6f0 = uVar29;
  local_6ec = uVar29;
  local_6e8 = uVar29;
  local_6e4 = uVar29;
  local_6c0 = uVar30;
  local_6bc = uVar30;
  local_6b8 = uVar30;
  local_6b4 = uVar30;
  local_6b0 = uVar30;
  local_6ac = uVar30;
  local_6a8 = uVar30;
  local_6a4 = uVar30;
  local_680 = uVar31;
  local_67c = uVar31;
  local_678 = uVar31;
  local_674 = uVar31;
  local_670 = uVar31;
  local_66c = uVar31;
  local_668 = uVar31;
  local_664 = uVar31;
  local_640 = out_shift_00;
  local_63c = out_shift_00;
  local_638 = out_shift_00;
  local_634 = out_shift_00;
  local_630 = out_shift_00;
  local_62c = out_shift_00;
  local_628 = out_shift_00;
  local_624 = out_shift_00;
  local_600 = bd_00;
  local_5fc = bd_00;
  local_5f8 = bd_00;
  local_5f4 = bd_00;
  local_5f0 = bd_00;
  local_5ec = bd_00;
  local_5e8 = bd_00;
  local_5e4 = bd_00;
  local_5c0 = do_cols_00;
  local_5bc = do_cols_00;
  local_5b8 = do_cols_00;
  local_5b4 = do_cols_00;
  local_5b0 = do_cols_00;
  local_5ac = do_cols_00;
  local_5a8 = do_cols_00;
  local_5a4 = do_cols_00;
  local_580 = uVar32;
  local_57c = uVar32;
  local_578 = uVar32;
  local_574 = uVar32;
  local_570 = uVar32;
  local_56c = uVar32;
  local_568 = uVar32;
  local_564 = uVar32;
  local_540 = uVar5;
  local_53c = uVar5;
  local_538 = uVar5;
  local_534 = uVar5;
  local_530 = uVar5;
  local_52c = uVar5;
  local_528 = uVar5;
  local_524 = uVar5;
  local_500 = uVar6;
  local_4fc = uVar6;
  local_4f8 = uVar6;
  local_4f4 = uVar6;
  local_4f0 = uVar6;
  local_4ec = uVar6;
  local_4e8 = uVar6;
  local_4e4 = uVar6;
  local_4c0 = uVar7;
  local_4bc = uVar7;
  local_4b8 = uVar7;
  local_4b4 = uVar7;
  local_4b0 = uVar7;
  local_4ac = uVar7;
  local_4a8 = uVar7;
  local_4a4 = uVar7;
  local_480 = uVar8;
  local_47c = uVar8;
  local_478 = uVar8;
  local_474 = uVar8;
  local_470 = uVar8;
  local_46c = uVar8;
  local_468 = uVar8;
  local_464 = uVar8;
  local_440 = uVar9;
  local_43c = uVar9;
  local_438 = uVar9;
  local_434 = uVar9;
  local_430 = uVar9;
  local_42c = uVar9;
  local_428 = uVar9;
  local_424 = uVar9;
  local_400 = uVar10;
  local_3fc = uVar10;
  local_3f8 = uVar10;
  local_3f4 = uVar10;
  local_3f0 = uVar10;
  local_3ec = uVar10;
  local_3e8 = uVar10;
  local_3e4 = uVar10;
  local_3c0 = uVar11;
  local_3bc = uVar11;
  local_3b8 = uVar11;
  local_3b4 = uVar11;
  local_3b0 = uVar11;
  local_3ac = uVar11;
  local_3a8 = uVar11;
  local_3a4 = uVar11;
  local_380 = uVar12;
  local_37c = uVar12;
  local_378 = uVar12;
  local_374 = uVar12;
  local_370 = uVar12;
  local_36c = uVar12;
  local_368 = uVar12;
  local_364 = uVar12;
  local_340 = uVar13;
  local_33c = uVar13;
  local_338 = uVar13;
  local_334 = uVar13;
  local_330 = uVar13;
  local_32c = uVar13;
  local_328 = uVar13;
  local_324 = uVar13;
  local_300 = uVar14;
  local_2fc = uVar14;
  local_2f8 = uVar14;
  local_2f4 = uVar14;
  local_2f0 = uVar14;
  local_2ec = uVar14;
  local_2e8 = uVar14;
  local_2e4 = uVar14;
  local_2c0 = uVar15;
  local_2bc = uVar15;
  local_2b8 = uVar15;
  local_2b4 = uVar15;
  local_2b0 = uVar15;
  local_2ac = uVar15;
  local_2a8 = uVar15;
  local_2a4 = uVar15;
  local_280 = uVar16;
  local_27c = uVar16;
  local_278 = uVar16;
  local_274 = uVar16;
  local_270 = uVar16;
  local_26c = uVar16;
  local_268 = uVar16;
  local_264 = uVar16;
  local_240 = uVar17;
  local_23c = uVar17;
  local_238 = uVar17;
  local_234 = uVar17;
  local_230 = uVar17;
  local_22c = uVar17;
  local_228 = uVar17;
  local_224 = uVar17;
  local_200 = uVar33;
  local_1fc = uVar33;
  local_1f8 = uVar33;
  local_1f4 = uVar33;
  local_1f0 = uVar33;
  local_1ec = uVar33;
  local_1e8 = uVar33;
  local_1e4 = uVar33;
  local_1c0 = uVar18;
  local_1bc = uVar18;
  local_1b8 = uVar18;
  local_1b4 = uVar18;
  local_1b0 = uVar18;
  local_1ac = uVar18;
  local_1a8 = uVar18;
  local_1a4 = uVar18;
  local_180 = uVar34;
  local_17c = uVar34;
  local_178 = uVar34;
  local_174 = uVar34;
  local_170 = uVar34;
  local_16c = uVar34;
  local_168 = uVar34;
  local_164 = uVar34;
  local_140 = uVar35;
  local_13c = uVar35;
  local_138 = uVar35;
  local_134 = uVar35;
  local_130 = uVar35;
  local_12c = uVar35;
  local_128 = uVar35;
  local_124 = uVar35;
  local_100 = local_af8;
  local_fc = local_af8;
  local_f8 = local_af8;
  local_f4 = local_af8;
  local_f0 = local_af8;
  local_ec = local_af8;
  local_e8 = local_af8;
  local_e4 = local_af8;
  local_c0 = local_afc;
  local_bc = local_afc;
  local_b8 = local_afc;
  local_b4 = local_afc;
  local_b0 = local_afc;
  local_ac = local_afc;
  local_a8 = local_afc;
  local_a4 = local_afc;
  local_80 = local_b00;
  local_7c = local_b00;
  local_78 = local_b00;
  local_74 = local_b00;
  local_70 = local_b00;
  local_6c = local_b00;
  local_68 = local_b00;
  local_64 = local_b00;
  local_40 = local_b04;
  local_3c = local_b04;
  local_38 = local_b04;
  local_34 = local_b04;
  local_30 = local_b04;
  local_2c = local_b04;
  local_28 = local_b04;
  local_24 = local_b04;
  local_b60 = local_a60._0_16_;
  auStack_b50 = local_a60._16_16_;
  half_btf_0_avx2(in_stack_ffffffffffffe690,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),bit_00);
  half_btf_0_avx2(in_stack_ffffffffffffe690,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),bit_00);
  half_btf_0_avx2(in_stack_ffffffffffffe690,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),bit_00);
  half_btf_0_avx2(in_stack_ffffffffffffe690,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),bit_00);
  half_btf_0_avx2(in_stack_ffffffffffffe690,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),bit_00);
  half_btf_0_avx2(in_stack_ffffffffffffe690,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),bit_00);
  half_btf_0_avx2(in_stack_ffffffffffffe690,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),bit_00);
  half_btf_0_avx2(in_stack_ffffffffffffe690,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),bit_00);
  half_btf_0_avx2(in_stack_ffffffffffffe690,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),bit_00);
  half_btf_0_avx2(in_stack_ffffffffffffe690,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),bit_00);
  half_btf_0_avx2(in_stack_ffffffffffffe690,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),bit_00);
  half_btf_0_avx2(in_stack_ffffffffffffe690,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),bit_00);
  half_btf_0_avx2(in_stack_ffffffffffffe690,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),bit_00);
  half_btf_0_avx2(in_stack_ffffffffffffe690,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_0_avx2(in_stack_ffffffffffffe690,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),bit_00);
  half_btf_0_avx2(in_stack_ffffffffffffe690,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar31),(__m256i *)CONCAT44(uVar30,uVar29),
                (__m256i *)CONCAT44(uVar28,uVar27),(__m256i *)CONCAT44(uVar26,uVar25),
                (__m256i *)CONCAT44(uVar24,uVar23),bit_01);
  for (local_b2c = 0x20; local_b2c < 0x40; local_b2c = local_b2c + 0x10) {
    for (local_b30 = local_b2c; local_b30 < local_b2c + 4; local_b30 = local_b30 + 1) {
      in0[0]._4_4_ = do_cols_00;
      in0[0]._0_4_ = bd_00;
      in0[1]._0_4_ = uVar32;
      in0[1]._4_4_ = uVar5;
      in0[2]._0_4_ = uVar6;
      in0[2]._4_4_ = uVar7;
      in0[3]._0_4_ = uVar8;
      in0[3]._4_4_ = uVar9;
      in1[0]._4_4_ = uVar26;
      in1[0]._0_4_ = uVar25;
      in1[1]._0_4_ = uVar27;
      in1[1]._4_4_ = uVar28;
      in1[2]._0_4_ = uVar29;
      in1[2]._4_4_ = uVar30;
      in1[3]._0_4_ = uVar31;
      in1[3]._4_4_ = out_shift_00;
      addsub_avx2(in0,in1,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_01,uVar22),
                  (__m256i *)CONCAT44(uVar21,uVar20),(__m256i *)CONCAT44(uVar4,uVar19));
      in0_00[0]._4_4_ = do_cols_00;
      in0_00[0]._0_4_ = bd_00;
      in0_00[1]._0_4_ = uVar32;
      in0_00[1]._4_4_ = uVar5;
      in0_00[2]._0_4_ = uVar6;
      in0_00[2]._4_4_ = uVar7;
      in0_00[3]._0_4_ = uVar8;
      in0_00[3]._4_4_ = uVar9;
      in1_00[0]._4_4_ = uVar26;
      in1_00[0]._0_4_ = uVar25;
      in1_00[1]._0_4_ = uVar27;
      in1_00[1]._4_4_ = uVar28;
      in1_00[2]._0_4_ = uVar29;
      in1_00[2]._4_4_ = uVar30;
      in1_00[3]._0_4_ = uVar31;
      in1_00[3]._4_4_ = out_shift_00;
      addsub_avx2(in0_00,in1_00,(__m256i *)CONCAT44(uVar24,uVar23),
                  (__m256i *)CONCAT44(bit_01,uVar22),(__m256i *)CONCAT44(uVar21,uVar20),
                  (__m256i *)CONCAT44(uVar4,uVar19));
    }
  }
  cospim48_00 = (__m256i *)&local_ba0;
  idct64_stage8_avx2((__m256i *)CONCAT44(uVar35,uVar34),(__m256i *)CONCAT44(uVar18,uVar33),
                     (__m256i *)CONCAT44(uVar17,uVar16),(__m256i *)CONCAT44(uVar15,uVar14),
                     (__m256i *)CONCAT44(uVar13,uVar12),(__m256i *)CONCAT44(uVar11,uVar10),
                     cospim48_00,(__m256i *)&local_bc0,(__m256i *)local_b60,
                     (__m256i *)CONCAT44(in_stack_ffffffffffffe684,local_b1c),
                     in_stack_ffffffffffffe688);
  idct64_stage9_avx2((__m256i *)CONCAT44(uVar35,uVar34),(__m256i *)CONCAT44(uVar18,uVar33),
                     (__m256i *)CONCAT44(uVar17,uVar16),(__m256i *)CONCAT44(uVar15,uVar14),
                     (__m256i *)CONCAT44(uVar13,uVar12),(__m256i *)CONCAT44(uVar11,uVar10),
                     (int)cospim48_00);
  idct64_stage10_avx2((__m256i *)CONCAT44(uVar35,uVar34),(__m256i *)CONCAT44(uVar18,uVar33),
                      (__m256i *)CONCAT44(uVar17,uVar16),(__m256i *)CONCAT44(uVar15,uVar14),
                      (__m256i *)CONCAT44(uVar13,uVar12),(__m256i *)CONCAT44(uVar11,uVar10),
                      (int)cospim48_00);
  idct64_stage11_avx2((__m256i *)CONCAT44(uVar7,uVar6),(__m256i *)CONCAT44(uVar5,uVar32),do_cols_00,
                      bd_00,out_shift_00,(__m256i *)CONCAT44(uVar30,uVar29),cospim48_00);
  return;
}

Assistant:

static void idct64_low8_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                             int bd, int out_shift) {
  int i, j;
  const int32_t *cospi = cospi_arr(bit);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);

  const __m256i cospi1 = _mm256_set1_epi32(cospi[1]);
  const __m256i cospi2 = _mm256_set1_epi32(cospi[2]);
  const __m256i cospi3 = _mm256_set1_epi32(cospi[3]);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospi6 = _mm256_set1_epi32(cospi[6]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospi20 = _mm256_set1_epi32(cospi[20]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospi28 = _mm256_set1_epi32(cospi[28]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi44 = _mm256_set1_epi32(cospi[44]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospim4 = _mm256_set1_epi32(-cospi[4]);
  const __m256i cospim8 = _mm256_set1_epi32(-cospi[8]);
  const __m256i cospim12 = _mm256_set1_epi32(-cospi[12]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i cospim20 = _mm256_set1_epi32(-cospi[20]);
  const __m256i cospim24 = _mm256_set1_epi32(-cospi[24]);
  const __m256i cospim28 = _mm256_set1_epi32(-cospi[28]);
  const __m256i cospim32 = _mm256_set1_epi32(-cospi[32]);
  const __m256i cospim36 = _mm256_set1_epi32(-cospi[36]);
  const __m256i cospim40 = _mm256_set1_epi32(-cospi[40]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospim52 = _mm256_set1_epi32(-cospi[52]);
  const __m256i cospim56 = _mm256_set1_epi32(-cospi[56]);
  const __m256i cospi63 = _mm256_set1_epi32(cospi[63]);
  const __m256i cospim57 = _mm256_set1_epi32(-cospi[57]);
  const __m256i cospi7 = _mm256_set1_epi32(cospi[7]);
  const __m256i cospi5 = _mm256_set1_epi32(cospi[5]);
  const __m256i cospi59 = _mm256_set1_epi32(cospi[59]);
  const __m256i cospim61 = _mm256_set1_epi32(-cospi[61]);
  const __m256i cospim58 = _mm256_set1_epi32(-cospi[58]);
  const __m256i cospi62 = _mm256_set1_epi32(cospi[62]);

  {
    __m256i u[64];

    // stage 1
    u[0] = in[0];
    u[8] = in[4];
    u[16] = in[2];
    u[24] = in[6];
    u[32] = in[1];
    u[40] = in[5];
    u[48] = in[3];
    u[56] = in[7];

    // stage 2
    u[63] = half_btf_0_avx2(&cospi1, &u[32], &rnding, bit);
    u[32] = half_btf_0_avx2(&cospi63, &u[32], &rnding, bit);
    u[39] = half_btf_0_avx2(&cospim57, &u[56], &rnding, bit);
    u[56] = half_btf_0_avx2(&cospi7, &u[56], &rnding, bit);
    u[55] = half_btf_0_avx2(&cospi5, &u[40], &rnding, bit);
    u[40] = half_btf_0_avx2(&cospi59, &u[40], &rnding, bit);
    u[47] = half_btf_0_avx2(&cospim61, &u[48], &rnding, bit);
    u[48] = half_btf_0_avx2(&cospi3, &u[48], &rnding, bit);

    // stage 3
    u[31] = half_btf_0_avx2(&cospi2, &u[16], &rnding, bit);
    u[16] = half_btf_0_avx2(&cospi62, &u[16], &rnding, bit);
    u[23] = half_btf_0_avx2(&cospim58, &u[24], &rnding, bit);
    u[24] = half_btf_0_avx2(&cospi6, &u[24], &rnding, bit);
    u[33] = u[32];
    u[38] = u[39];
    u[41] = u[40];
    u[46] = u[47];
    u[49] = u[48];
    u[54] = u[55];
    u[57] = u[56];
    u[62] = u[63];

    // stage 4
    __m256i temp1, temp2;
    u[15] = half_btf_0_avx2(&cospi4, &u[8], &rnding, bit);
    u[8] = half_btf_0_avx2(&cospi60, &u[8], &rnding, bit);
    u[17] = u[16];
    u[22] = u[23];
    u[25] = u[24];
    u[30] = u[31];

    temp1 = half_btf_avx2(&cospim4, &u[33], &cospi60, &u[62], &rnding, bit);
    u[62] = half_btf_avx2(&cospi60, &u[33], &cospi4, &u[62], &rnding, bit);
    u[33] = temp1;

    temp2 = half_btf_avx2(&cospim36, &u[38], &cospi28, &u[57], &rnding, bit);
    u[38] = half_btf_avx2(&cospim28, &u[38], &cospim36, &u[57], &rnding, bit);
    u[57] = temp2;

    temp1 = half_btf_avx2(&cospim20, &u[41], &cospi44, &u[54], &rnding, bit);
    u[54] = half_btf_avx2(&cospi44, &u[41], &cospi20, &u[54], &rnding, bit);
    u[41] = temp1;

    temp2 = half_btf_avx2(&cospim12, &u[46], &cospim52, &u[49], &rnding, bit);
    u[49] = half_btf_avx2(&cospim52, &u[46], &cospi12, &u[49], &rnding, bit);
    u[46] = temp2;

    // stage 5
    u[9] = u[8];
    u[14] = u[15];

    temp1 = half_btf_avx2(&cospim8, &u[17], &cospi56, &u[30], &rnding, bit);
    u[30] = half_btf_avx2(&cospi56, &u[17], &cospi8, &u[30], &rnding, bit);
    u[17] = temp1;

    temp2 = half_btf_avx2(&cospim24, &u[22], &cospim40, &u[25], &rnding, bit);
    u[25] = half_btf_avx2(&cospim40, &u[22], &cospi24, &u[25], &rnding, bit);
    u[22] = temp2;

    u[35] = u[32];
    u[34] = u[33];
    u[36] = u[39];
    u[37] = u[38];
    u[43] = u[40];
    u[42] = u[41];
    u[44] = u[47];
    u[45] = u[46];
    u[51] = u[48];
    u[50] = u[49];
    u[52] = u[55];
    u[53] = u[54];
    u[59] = u[56];
    u[58] = u[57];
    u[60] = u[63];
    u[61] = u[62];

    // stage 6
    temp1 = half_btf_0_avx2(&cospi32, &u[0], &rnding, bit);
    u[1] = half_btf_0_avx2(&cospi32, &u[0], &rnding, bit);
    u[0] = temp1;

    temp2 = half_btf_avx2(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
    u[14] = half_btf_avx2(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
    u[9] = temp2;
    u[19] = u[16];
    u[18] = u[17];
    u[20] = u[23];
    u[21] = u[22];
    u[27] = u[24];
    u[26] = u[25];
    u[28] = u[31];
    u[29] = u[30];

    temp1 = half_btf_avx2(&cospim8, &u[34], &cospi56, &u[61], &rnding, bit);
    u[61] = half_btf_avx2(&cospi56, &u[34], &cospi8, &u[61], &rnding, bit);
    u[34] = temp1;
    temp2 = half_btf_avx2(&cospim8, &u[35], &cospi56, &u[60], &rnding, bit);
    u[60] = half_btf_avx2(&cospi56, &u[35], &cospi8, &u[60], &rnding, bit);
    u[35] = temp2;
    temp1 = half_btf_avx2(&cospim56, &u[36], &cospim8, &u[59], &rnding, bit);
    u[59] = half_btf_avx2(&cospim8, &u[36], &cospi56, &u[59], &rnding, bit);
    u[36] = temp1;
    temp2 = half_btf_avx2(&cospim56, &u[37], &cospim8, &u[58], &rnding, bit);
    u[58] = half_btf_avx2(&cospim8, &u[37], &cospi56, &u[58], &rnding, bit);
    u[37] = temp2;
    temp1 = half_btf_avx2(&cospim40, &u[42], &cospi24, &u[53], &rnding, bit);
    u[53] = half_btf_avx2(&cospi24, &u[42], &cospi40, &u[53], &rnding, bit);
    u[42] = temp1;
    temp2 = half_btf_avx2(&cospim40, &u[43], &cospi24, &u[52], &rnding, bit);
    u[52] = half_btf_avx2(&cospi24, &u[43], &cospi40, &u[52], &rnding, bit);
    u[43] = temp2;
    temp1 = half_btf_avx2(&cospim24, &u[44], &cospim40, &u[51], &rnding, bit);
    u[51] = half_btf_avx2(&cospim40, &u[44], &cospi24, &u[51], &rnding, bit);
    u[44] = temp1;
    temp2 = half_btf_avx2(&cospim24, &u[45], &cospim40, &u[50], &rnding, bit);
    u[50] = half_btf_avx2(&cospim40, &u[45], &cospi24, &u[50], &rnding, bit);
    u[45] = temp2;

    // stage 7
    u[3] = u[0];
    u[2] = u[1];
    u[11] = u[8];
    u[10] = u[9];
    u[12] = u[15];
    u[13] = u[14];

    temp1 = half_btf_avx2(&cospim16, &u[18], &cospi48, &u[29], &rnding, bit);
    u[29] = half_btf_avx2(&cospi48, &u[18], &cospi16, &u[29], &rnding, bit);
    u[18] = temp1;
    temp2 = half_btf_avx2(&cospim16, &u[19], &cospi48, &u[28], &rnding, bit);
    u[28] = half_btf_avx2(&cospi48, &u[19], &cospi16, &u[28], &rnding, bit);
    u[19] = temp2;
    temp1 = half_btf_avx2(&cospim48, &u[20], &cospim16, &u[27], &rnding, bit);
    u[27] = half_btf_avx2(&cospim16, &u[20], &cospi48, &u[27], &rnding, bit);
    u[20] = temp1;
    temp2 = half_btf_avx2(&cospim48, &u[21], &cospim16, &u[26], &rnding, bit);
    u[26] = half_btf_avx2(&cospim16, &u[21], &cospi48, &u[26], &rnding, bit);
    u[21] = temp2;
    for (i = 32; i < 64; i += 16) {
      for (j = i; j < i + 4; j++) {
        addsub_avx2(u[j], u[j ^ 7], &u[j], &u[j ^ 7], &clamp_lo, &clamp_hi);
        addsub_avx2(u[j ^ 15], u[j ^ 8], &u[j ^ 15], &u[j ^ 8], &clamp_lo,
                    &clamp_hi);
      }
    }

    // stage 8
    u[7] = u[0];
    u[6] = u[1];
    u[5] = u[2];
    u[4] = u[3];

    idct64_stage8_avx2(u, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                       &cospim48, &clamp_lo, &clamp_hi, &rnding, bit);

    // stage 9
    idct64_stage9_avx2(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                       bit);

    // stage 10
    idct64_stage10_avx2(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                        bit);

    // stage 11
    idct64_stage11_avx2(u, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
  }
}